

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O3

bool sptk::ReadStream<unsigned_char>(uchar *data_to_read,istream *input_stream)

{
  if (((input_stream != (istream *)0x0 && data_to_read != (uchar *)0x0) &&
      (((byte)input_stream[*(long *)(*(long *)input_stream + -0x18) + 0x20] & 2) == 0)) &&
     (std::istream::read((char *)input_stream,(long)data_to_read), *(long *)(input_stream + 8) == 1)
     ) {
    return ((byte)input_stream[*(long *)(*(long *)input_stream + -0x18) + 0x20] & 5) == 0;
  }
  return false;
}

Assistant:

bool ReadStream(T* data_to_read, std::istream* input_stream) {
  if (NULL == data_to_read || NULL == input_stream || input_stream->eof()) {
    return false;
  }

  const int type_byte(sizeof(*data_to_read));
  input_stream->read(reinterpret_cast<char*>(data_to_read), type_byte);

  return (type_byte == input_stream->gcount()) ? !input_stream->fail() : false;
}